

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O1

FT_Error __thiscall FreeTypeFaceWrapper::DoneFace(FreeTypeFaceWrapper *this)

{
  FT_Error FVar1;
  
  if (this->mFace == (FT_Face)0x0) {
    FVar1 = 0;
  }
  else {
    FVar1 = FT_Done_Face(this->mFace);
    this->mFace = (FT_Face)0x0;
    if (this->mFormatParticularWrapper != (IFreeTypeFaceExtender *)0x0) {
      (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[1])();
    }
    this->mFormatParticularWrapper = (IFreeTypeFaceExtender *)0x0;
  }
  return FVar1;
}

Assistant:

FT_Error FreeTypeFaceWrapper::DoneFace()
{
	if(mFace)
	{
		FT_Error status = FT_Done_Face(mFace);
		mFace = NULL;
		delete mFormatParticularWrapper;
		mFormatParticularWrapper = NULL;
		return status;
	}
	else
		return 0;
}